

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_strtou32(string *str,uint32 *value)

{
  bool bVar1;
  string local_38;
  uint *local_18;
  uint32 *value_local;
  string *str_local;
  
  local_18 = value;
  value_local = (uint32 *)str;
  std::__cxx11::string::string((string *)&local_38,(string *)str);
  bVar1 = safe_uint_internal<unsigned_int>(&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool safe_strtou32(const std::string &str, uint32 *value) {
  return safe_uint_internal(str, value);
}